

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GLContextState.cpp
# Opt level: O2

void __thiscall Diligent::GLContextState::EnableDepthTest(GLContextState *this,bool bEnable)

{
  ENABLE_STATE EVar1;
  undefined7 in_register_00000031;
  GLenum err;
  string msg;
  
  EVar1 = DISABLED - (int)CONCAT71(in_register_00000031,bEnable);
  if ((this->m_DSState).m_DepthEnableState.m_EnableState == EVar1) {
    return;
  }
  if (bEnable) {
    glEnable();
    err = glGetError();
    if (err == 0) goto LAB_0030e75c;
    LogError<false,char[28],char[17],unsigned_int>
              (false,"EnableDepthTest",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineOpenGL/src/GLContextState.cpp"
               ,0x1da,(char (*) [28])"Failed to enable depth test",
               (char (*) [17])"\nGL Error Code: ",&err);
    FormatString<char[6]>(&msg,(char (*) [6])0x731c01);
    DebugAssertionFailed
              (msg._M_dataplus._M_p,"EnableDepthTest",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineOpenGL/src/GLContextState.cpp"
               ,0x1da);
  }
  else {
    glDisable();
    err = glGetError();
    if (err == 0) goto LAB_0030e75c;
    LogError<false,char[29],char[17],unsigned_int>
              (false,"EnableDepthTest",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineOpenGL/src/GLContextState.cpp"
               ,0x1df,(char (*) [29])"Failed to disable depth test",
               (char (*) [17])"\nGL Error Code: ",&err);
    FormatString<char[6]>(&msg,(char (*) [6])0x731c01);
    DebugAssertionFailed
              (msg._M_dataplus._M_p,"EnableDepthTest",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineOpenGL/src/GLContextState.cpp"
               ,0x1df);
  }
  std::__cxx11::string::~string((string *)&msg);
LAB_0030e75c:
  (this->m_DSState).m_DepthEnableState.m_EnableState = EVar1;
  return;
}

Assistant:

void GLContextState::EnableDepthTest(bool bEnable)
{
    if (m_DSState.m_DepthEnableState != bEnable)
    {
        if (bEnable)
        {
            glEnable(GL_DEPTH_TEST);
            DEV_CHECK_GL_ERROR("Failed to enable depth test");
        }
        else
        {
            glDisable(GL_DEPTH_TEST);
            DEV_CHECK_GL_ERROR("Failed to disable depth test");
        }
        m_DSState.m_DepthEnableState = bEnable;
    }
}